

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O3

Iterator * __thiscall
wasm::
SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
::SCC::Iterator::operator++(Iterator *this)

{
  pointer *ppHVar1;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *pSVar2;
  pointer pHVar3;
  _Storage<wasm::HeapType,_true> _Var4;
  mapped_type *pmVar5;
  
  pSVar2 = this->parent;
  if ((pSVar2->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged != false) {
    pHVar3 = (pSVar2->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((_Storage<wasm::HeapType,_true>)pHVar3[-1].id ==
        (pSVar2->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload) {
      (pSVar2->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
    }
    pmVar5 = std::
             unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
             ::operator[](&pSVar2->elementInfo,pHVar3 + -1);
    pmVar5->onStack = false;
    ppHVar1 = &(pSVar2->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppHVar1 = *ppHVar1 + -1;
    pSVar2 = this->parent;
    if ((pSVar2 == (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                    *)0x0) ||
       ((pSVar2->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged == false)) {
      if ((this->val).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
        (this->val).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
      }
    }
    else {
      _Var4 = (_Storage<wasm::HeapType,_true>)
              (pSVar2->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1].id;
      if ((this->val).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
        (this->val).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
      }
      (this->val).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload = _Var4;
    }
    return this;
  }
  __assert_fail("currRoot",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                ,0x97,
                "void wasm::SCCs<__gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, wasm::(anonymous namespace)::TypeSCCs>::stepToNextElem() [It = __gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, Class = wasm::(anonymous namespace)::TypeSCCs]"
               );
}

Assistant:

Iterator& operator++() {
        parent->stepToNextElem();
        setVal();
        return *this;
      }